

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O0

char * upb_MtDataEncoder_PutBase92Varint
                 (upb_MtDataEncoder *e,char *ptr,uint32_t val,int min,int max)

{
  char cVar1;
  char cVar2;
  int iVar3;
  uint32_t bits;
  uint32_t mask;
  int shift;
  int max_local;
  int min_local;
  uint32_t val_local;
  char *ptr_local;
  upb_MtDataEncoder *e_local;
  
  cVar1 = _upb_FromBase92((uint8_t)max);
  cVar2 = _upb_FromBase92((uint8_t)min);
  iVar3 = upb_Log2Ceiling(((int)cVar1 - (int)cVar2) + 1);
  if (6 < iVar3) {
    __assert_fail("shift <= 6",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/mini_descriptor/internal/encode.c"
                  ,0x45,
                  "char *upb_MtDataEncoder_PutBase92Varint(upb_MtDataEncoder *, char *, uint32_t, int, int)"
                 );
  }
  max_local = val;
  _min_local = ptr;
  do {
    cVar1 = _upb_FromBase92((uint8_t)min);
    _min_local = upb_MtDataEncoder_Put
                           (e,_min_local,
                            ((byte)max_local & (char)(1 << ((byte)iVar3 & 0x1f)) - 1U) + cVar1);
    if (_min_local == (char *)0x0) {
      return (char *)0x0;
    }
    max_local = (uint)max_local >> ((byte)iVar3 & 0x1f);
  } while (max_local != 0);
  return _min_local;
}

Assistant:

static char* upb_MtDataEncoder_PutBase92Varint(upb_MtDataEncoder* e, char* ptr,
                                               uint32_t val, int min, int max) {
  int shift = upb_Log2Ceiling(_upb_FromBase92(max) - _upb_FromBase92(min) + 1);
  UPB_ASSERT(shift <= 6);
  uint32_t mask = (1 << shift) - 1;
  do {
    uint32_t bits = val & mask;
    ptr = upb_MtDataEncoder_Put(e, ptr, bits + _upb_FromBase92(min));
    if (!ptr) return NULL;
    val >>= shift;
  } while (val);
  return ptr;
}